

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

void * operator_new(size_t size,align_val_t align)

{
  void *p;
  align_val_t local_38;
  memalign_retry_data data;
  
  p = do_debug_memalign(align,size,-0x145237f);
  if (p == (void *)0x0) {
    data.size._0_4_ = 0xfebadc81;
    local_38 = align;
    data.align = size;
    p = anon_unknown.dwarf_505b::handle_oom(retry_debug_memalign,&local_38,true,false);
  }
  if (base::internal::new_hooks_ != 0) {
    tcmalloc::InvokeNewHookSlow(p,size);
  }
  return p;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_new_aligned(size_t size, std::align_val_t align) {
  void* result = do_debug_memalign_or_debug_cpp_memalign(static_cast<size_t>(align), size, MallocBlock::kNewType, true, false);
  tcmalloc::InvokeNewHook(result, size);
  return result;
}